

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addTagPattern(TestSpecParser *this)

{
  ulong uVar1;
  undefined4 *in_RDI;
  TestSpecParser *in_stack_00000018;
  PatternPtr pattern;
  PatternPtr pattern_1;
  string token;
  shared_ptr<Catch::TestSpec::ExcludedPattern> *in_stack_ffffffffffffff28;
  shared_ptr<Catch::TestSpec::Pattern> *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff38;
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined8 local_40;
  shared_ptr<Catch::TestSpec::Pattern> local_28 [2];
  
  preprocessPattern_abi_cxx11_(in_stack_00000018);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::size();
    if (1 < uVar1) {
      in_stack_ffffffffffffff40 =
           (vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
            *)std::__cxx11::string::operator[]((ulong)local_28);
      if (*(char *)&(in_stack_ffffffffffffff40->
                    super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                    )._M_impl.super__Vector_impl_data._M_start == '.') {
        in_stack_ffffffffffffff30 = local_28;
        std::__cxx11::string::begin();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff30,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff38 =
             (value_type *)std::__cxx11::string::erase(in_stack_ffffffffffffff30,local_40);
        std::make_shared<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                  ((char (*) [2])in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::TagPattern,void>
                  (in_stack_ffffffffffffff30,
                   (shared_ptr<Catch::TestSpec::TagPattern> *)in_stack_ffffffffffffff28);
        clara::std::shared_ptr<Catch::TestSpec::TagPattern>::~shared_ptr
                  ((shared_ptr<Catch::TestSpec::TagPattern> *)0x12e7b8);
        if ((*(byte *)(in_RDI + 2) & 1) != 0) {
          std::
          make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                    ((shared_ptr<Catch::TestSpec::Pattern> *)in_stack_ffffffffffffff58);
          std::shared_ptr<Catch::TestSpec::Pattern>::operator=
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr
                    ((shared_ptr<Catch::TestSpec::ExcludedPattern> *)0x12e7ed);
        }
        clara::std::
        vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
        ::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
                  ((shared_ptr<Catch::TestSpec::Pattern> *)0x12e84d);
      }
    }
    std::make_shared<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::TagPattern,void>
              (in_stack_ffffffffffffff30,
               (shared_ptr<Catch::TestSpec::TagPattern> *)in_stack_ffffffffffffff28);
    clara::std::shared_ptr<Catch::TestSpec::TagPattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::TagPattern> *)0x12e883);
    if ((*(byte *)(in_RDI + 2) & 1) != 0) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)in_stack_ffffffffffffff58);
      std::shared_ptr<Catch::TestSpec::Pattern>::operator=
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr
                ((shared_ptr<Catch::TestSpec::ExcludedPattern> *)0x12e8b8);
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::Pattern> *)0x12e8fc);
  }
  std::__cxx11::string::clear();
  *(undefined1 *)(in_RDI + 2) = 0;
  *in_RDI = 0;
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void TestSpecParser::addTagPattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            // If the tag pattern is the "hide and tag" shorthand (e.g. [.foo])
            // we have to create a separate hide tag and shorten the real one
            if (token.size() > 1 && token[0] == '.') {
                token.erase(token.begin());
                TestSpec::PatternPtr pattern = std::make_shared<TestSpec::TagPattern>(".", m_substring);
                if (m_exclusion) {
                    pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
                }
                m_currentFilter.m_patterns.push_back(pattern);
            }

            TestSpec::PatternPtr pattern = std::make_shared<TestSpec::TagPattern>(token, m_substring);

            if (m_exclusion) {
                pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
            }
            m_currentFilter.m_patterns.push_back(pattern);
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }